

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

void __thiscall Process::DupFd(Process *this,int from,int to)

{
  bool bVar1;
  runtime_error *this_00;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_int,_FDInfo>,_false> local_c0;
  _Node_iterator_base<std::pair<const_int,_FDInfo>,_false> local_b8;
  iterator jt;
  FDInfo info;
  FDInfo *oldInfo;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Node_iterator_base<std::pair<const_int,_FDInfo>,_false> local_28;
  _Node_iterator_base<std::pair<const_int,_FDInfo>,_false> local_20;
  iterator it;
  int to_local;
  int from_local;
  Process *this_local;
  
  it.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur._0_4_ = to;
  it.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur._4_4_ = from;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_FDInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_FDInfo>_>_>
       ::find(&this->files_,
              (key_type *)
              ((long)&it.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur + 4))
  ;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_FDInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_FDInfo>_>_>
       ::end(&this->files_);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_int,_FDInfo>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_int,_FDInfo>,_false,_false> *)&local_20);
    FDInfo::FDInfo((FDInfo *)&jt,
                   (int)it.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur,
                   &(ppVar2->second).Path,false);
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_FDInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_FDInfo>_>_>
         ::find(&this->files_,(key_type *)&it);
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_FDInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_FDInfo>_>_>
         ::end(&this->files_);
    bVar1 = std::__detail::operator==(&local_b8,&local_c0);
    if (bVar1) {
      std::
      unordered_map<int,FDInfo,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,FDInfo>>>
      ::emplace<int&,FDInfo&>
                ((unordered_map<int,FDInfo,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,FDInfo>>>
                  *)&this->files_,(int *)&it,(FDInfo *)&jt);
    }
    else {
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_int,_FDInfo>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_int,_FDInfo>,_false,_false> *)&local_b8);
      FDInfo::operator=(&ppVar2->second,(FDInfo *)&jt);
    }
    FDInfo::~FDInfo((FDInfo *)&jt);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string
            (&local_68,
             it.super__Node_iterator_base<std::pair<const_int,_FDInfo>,_false>._M_cur._4_4_);
  std::operator+(&local_48,"Unknown file descriptor: ",&local_68);
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Process::DupFd(int from, int to)
{
  auto it = files_.find(from);
  if (it == files_.end()) {
    throw std::runtime_error(
        "Unknown file descriptor: " + std::to_string(from)
    );
  }

  const auto &oldInfo = it->second;
  FDInfo info(to, oldInfo.Path, false);

  auto jt = files_.find(to);
  if (jt == files_.end()) {
    files_.emplace(to, info);
  } else {
    jt->second = info;
  }
}